

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase154::run(TestCase154 *this)

{
  Reader reader;
  undefined1 auVar1 [32];
  Reader reader_00;
  long lVar2;
  bool bVar3;
  int iVar4;
  double dVar5;
  Reader value;
  double local_1d8;
  double local_1d0 [4];
  undefined6 uStack_1b0;
  undefined2 uStack_1aa;
  undefined6 uStack_1a8;
  ushort uStack_1a2;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined6 uStack_180;
  undefined2 uStack_17a;
  undefined6 uStack_178;
  ushort uStack_172;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  Reader copy;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  *(undefined4 *)((long)root._builder.data + 0x14) = 0x7b;
  *(undefined8 *)((long)root._builder.data + 0x28) = 0x3ff8000000000000;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&root,value);
  copy._reader.dataSize = root._builder.dataSize & 0xffffffc0;
  copy._reader.segment = (SegmentReader *)0x0;
  copy._reader.capTable = (CapTableReader *)0x0;
  copy._reader.data = root._builder.data;
  copy._reader.pointers = (WirePointer *)0x0;
  copy._reader.pointerCount = 0;
  copy._reader.nestingLimit = 0x7fffffff;
  if (root._builder.dataSize < 0xc0) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_001ef621;
    iVar4 = 0;
LAB_001ef579:
    local_1d8 = (double)CONCAT44(local_1d8._4_4_,0x7b);
    local_1d0[0] = (double)CONCAT44(local_1d0[0]._4_4_,iVar4);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0xa3,ERROR,
               "\"failed: expected \" \"(123) == (copy.getUInt32Field())\", 123, copy.getUInt32Field()"
               ,(char (*) [50])"failed: expected (123) == (copy.getUInt32Field())",(int *)&local_1d8
               ,(uint *)local_1d0);
  }
  else {
    iVar4 = *(int *)((long)root._builder.data + 0x14);
    if ((iVar4 != 0x7b) && (kj::_::Debug::minSeverity < 3)) goto LAB_001ef579;
  }
  if (root._builder.dataSize < 0x180) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_001ef621;
    dVar5 = 0.0;
  }
  else {
    dVar5 = *(double *)((long)root._builder.data + 0x28);
    if (((dVar5 == 1.5) && (!NAN(dVar5))) || (2 < kj::_::Debug::minSeverity)) goto LAB_001ef621;
  }
  local_1d8 = 1.5;
  local_1d0[0] = dVar5;
  kj::_::Debug::log<char_const(&)[51],double,double>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
             ,0xa4,ERROR,
             "\"failed: expected \" \"(1.5) == (copy.getFloat64Field())\", 1.5, copy.getFloat64Field()"
             ,(char (*) [51])"failed: expected (1.5) == (copy.getFloat64Field())",&local_1d8,
             local_1d0);
LAB_001ef621:
  bVar3 = capnproto_test::capnp::test::TestAllTypes::Reader::hasTextField(&copy);
  if (bVar3 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0xa5,ERROR,"\"failed: expected \" \"!(copy.hasTextField())\"",
               (char (*) [40])"failed: expected !(copy.hasTextField())");
  }
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_17a = 0;
  uStack_178 = 0;
  uStack_170 = 0x7fffffff;
  lVar2 = (ulong)uStack_172 << 0x30;
  reader._reader._44_4_ = uStack_16c;
  reader._reader.nestingLimit = 0x7fffffff;
  auVar1 = ZEXT1632(ZEXT816(0));
  reader._reader.dataSize = (int)lVar2;
  reader._reader.pointerCount = (short)((ulong)lVar2 >> 0x20);
  reader._reader._38_2_ = (short)((ulong)lVar2 >> 0x30);
  reader._reader.segment = (SegmentReader *)auVar1._0_8_;
  reader._reader.capTable = (CapTableReader *)auVar1._8_8_;
  reader._reader.data = (void *)auVar1._16_8_;
  reader._reader.pointers = (WirePointer *)auVar1._24_8_;
  checkTestMessageAllZero(reader);
  local_1d0[3] = 0.0;
  uStack_1b0 = 0;
  local_1d0[1] = 0.0;
  local_1d0[2] = 0.0;
  uStack_1aa = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0x7fffffff;
  lVar2 = (ulong)uStack_1a2 << 0x30;
  reader_00._reader._44_4_ = uStack_19c;
  reader_00._reader.nestingLimit = 0x7fffffff;
  auVar1 = ZEXT1632(ZEXT816(0));
  reader_00._reader.dataSize = (int)lVar2;
  reader_00._reader.pointerCount = (short)((ulong)lVar2 >> 0x20);
  reader_00._reader._38_2_ = (short)((ulong)lVar2 >> 0x30);
  reader_00._reader.segment = (SegmentReader *)auVar1._0_8_;
  reader_00._reader.capTable = (CapTableReader *)auVar1._8_8_;
  reader_00._reader.data = (void *)auVar1._16_8_;
  reader_00._reader.pointers = (WirePointer *)auVar1._24_8_;
  checkTestMessageAllZero(reader_00);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Message, ReadWriteDataStruct) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();

  root.setUInt32Field(123);
  root.setFloat64Field(1.5);
  root.setTextField("foo");

  auto copy = readDataStruct<TestAllTypes>(writeDataStruct(root));
  EXPECT_EQ(123, copy.getUInt32Field());
  EXPECT_EQ(1.5, copy.getFloat64Field());
  EXPECT_FALSE(copy.hasTextField());

  checkTestMessageAllZero(readDataStruct<TestAllTypes>(nullptr));
  checkTestMessageAllZero(defaultValue<TestAllTypes>());
}